

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incppect.cpp
# Opt level: O0

thread __thiscall Incppect<true>::runAsync(Incppect<false> *this,Parameters *parameters)

{
  type *in_RSI;
  id in_RDI;
  thread *worker;
  Parameters *in_stack_ffffffffffffff50;
  
  Parameters::Parameters(in_stack_ffffffffffffff50,(Parameters *)in_RSI);
  std::thread::thread<Incppect<true>::runAsync(Incppect<true>::Parameters)::_lambda()_1_,,void>
            ((thread *)in_stack_ffffffffffffff50,in_RSI);
  runAsync(Incppect<true>::Parameters)::{lambda()#1}::~Parameters((type *)0x219063);
  return (thread)(id)in_RDI._M_thread;
}

Assistant:

std::thread Incppect<SSL>::runAsync(Parameters parameters) {
    std::thread worker([this, parameters]() { this->run(parameters); });
    return worker;
}